

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<int,float>
                (ImGuiDataType data_type,int v,int v_min,int v_max,float power,float linear_zero_pos
                )

{
  int iVar1;
  int iVar2;
  float fVar3;
  int local_3c;
  bool local_36;
  float f_1;
  float f;
  int v_clamped;
  bool is_power;
  float linear_zero_pos_local;
  float power_local;
  int v_max_local;
  int v_min_local;
  int v_local;
  ImGuiDataType data_type_local;
  
  if (v_min == v_max) {
    v_local = 0;
  }
  else {
    local_36 = false;
    if ((power != 1.0) || (NAN(power))) {
      local_36 = data_type == 8 || data_type == 9;
    }
    if (v_min < v_max) {
      local_3c = ImClamp<int>(v,v_min,v_max);
    }
    else {
      local_3c = ImClamp<int>(v,v_max,v_min);
    }
    if (local_36) {
      if (0.0 <= (float)local_3c) {
        iVar1 = ImMax<int>(0,v_min);
        iVar2 = ImMax<int>(0,v_min);
        fVar3 = ImPow((float)((local_3c - iVar1) / (v_max - iVar2)),1.0 / power);
        v_local = (int)(fVar3 * (1.0 - linear_zero_pos) + linear_zero_pos);
      }
      else {
        iVar1 = ImMin<int>(0,v_max);
        fVar3 = ImPow(1.0 - (float)((local_3c - v_min) / (iVar1 - v_min)),1.0 / power);
        v_local = (int)((1.0 - fVar3) * linear_zero_pos);
      }
    }
    else {
      v_local = (int)((float)(local_3c - v_min) / (float)(v_max - v_min));
    }
  }
  return (float)v_local;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}